

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

Gia_Man_t * Gia_ManFOFUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  iVar2 = Gia_ManAndNum(p);
  iVar2 = iVar2 << 2;
  p_00 = Gia_ManStart(p->nObjs * 9);
  pcVar8 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar8;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar12 = 0;
  while ((iVar12 < p->vCis->nSize && (pGVar9 = Gia_ManCi(p,iVar12), pGVar9 != (Gia_Obj_t *)0x0))) {
    uVar3 = Gia_ManAppendCi(p_00);
    pGVar9->Value = uVar3;
    iVar12 = iVar12 + 1;
  }
  iVar11 = 0;
  iVar12 = 0;
  while ((iVar11 < p->nObjs && (pGVar9 = Gia_ManObj(p,iVar11), pGVar9 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
      iVar4 = Vec_IntEntry(vMap,iVar12);
      iVar5 = Gia_ManAppendCi(p_00);
      if (iVar2 <= iVar12 + 1) {
        iVar5 = 0;
      }
      if (iVar4 == 0) {
        iVar5 = 0;
      }
      iVar6 = Vec_IntEntry(vMap,iVar12 + 1);
      iVar4 = Gia_ManAppendCi(p_00);
      if (iVar2 <= iVar12 + 2) {
        iVar4 = 0;
      }
      if (iVar6 == 0) {
        iVar4 = 0;
      }
      iVar13 = iVar12 + 3;
      iVar7 = Vec_IntEntry(vMap,iVar12 + 2);
      iVar6 = Gia_ManAppendCi(p_00);
      if (iVar2 <= iVar13) {
        iVar6 = 0;
      }
      if (iVar7 == 0) {
        iVar6 = 0;
      }
      iVar12 = iVar12 + 4;
      iVar13 = Vec_IntEntry(vMap,iVar13);
      iVar7 = Gia_ManAppendCi(p_00);
      if (iVar2 <= iVar12) {
        iVar7 = 0;
      }
      if (iVar13 == 0) {
        iVar7 = 0;
      }
      uVar1 = *(ulong *)pGVar9;
      if (((uint)uVar1 >> 0x1d & 1) == 0) {
        if ((uVar1 >> 0x3d & 1) == 0) {
          iVar7 = Abc_LitNot(iVar7);
        }
        else {
          iVar4 = Abc_LitNot(iVar4);
        }
      }
      else if ((uVar1 >> 0x3d & 1) == 0) {
        iVar6 = Abc_LitNot(iVar6);
      }
      else {
        iVar5 = Abc_LitNot(iVar5);
      }
      iVar5 = Gia_ManHashMux(p_00,pGVar9[-(*(ulong *)pGVar9 & 0x1fffffff)].Value,iVar4,iVar5);
      iVar4 = Gia_ManHashMux(p_00,pGVar9[-(*(ulong *)pGVar9 & 0x1fffffff)].Value,iVar7,iVar6);
      uVar3 = Gia_ManHashMux(p_00,pGVar9[-((ulong)*(uint *)&pGVar9->field_0x4 & 0x1fffffff)].Value,
                             iVar4,iVar5);
      pGVar9->Value = uVar3;
    }
    iVar11 = iVar11 + 1;
  }
  if (iVar12 == vMap->nSize) {
    iVar2 = 0;
    while ((iVar2 < p->vCos->nSize && (pGVar9 = Gia_ManCo(p,iVar2), pGVar9 != (Gia_Obj_t *)0x0))) {
      iVar12 = Gia_ObjFanin0Copy(pGVar9);
      uVar3 = Gia_ManAppendCo(p_00,iVar12);
      pGVar9->Value = uVar3;
      iVar2 = iVar2 + 1;
    }
    pGVar10 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    iVar2 = pGVar10->vCis->nSize;
    iVar12 = pGVar10->nRegs;
    iVar11 = p->vCis->nSize;
    iVar5 = Gia_ManAndNum(p);
    if (iVar2 - iVar12 != iVar11 + iVar5 * 4) {
      __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                    ,0x248,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
    }
    return pGVar10;
  }
  __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                ,0x243,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManFOFUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl0, iCtrl1, iCtrl2, iCtrl3, iMuxA, iMuxB, iFuncVars = 0;
    int VarLimit = 4 * Gia_ManAndNum(p);
    pNew = Gia_ManStart( 9 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl0 = Gia_ManAppendCi(pNew);
        else
            iCtrl0 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl1 = Gia_ManAppendCi(pNew);
        else
            iCtrl1 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl2 = Gia_ManAppendCi(pNew);
        else
            iCtrl2 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl3 = Gia_ManAppendCi(pNew);
        else
            iCtrl3 = 0, Gia_ManAppendCi(pNew);

        if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl0 = Abc_LitNot(iCtrl0);
        else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl1 = Abc_LitNot(iCtrl1);
        else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl2 = Abc_LitNot(iCtrl2);
        else //if ( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl3 = Abc_LitNot(iCtrl3);

        iMuxA       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl1, iCtrl0 );
        iMuxB       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl3, iCtrl2 );
        pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin1(pObj)->Value, iMuxB,  iMuxA );
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p) );
    return pNew;
}